

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree_absolute_path.c
# Opt level: O3

void test_write_format_mtree_absolute_path(void)

{
  wchar_t wVar1;
  int iVar2;
  mode_t mVar3;
  archive *paVar4;
  archive_entry *paVar5;
  char *pcVar6;
  la_int64_t v1;
  size_t used;
  size_t local_40;
  archive_entry *local_38;
  
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                   ,L'&',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  wVar1 = archive_write_set_format_mtree(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)wVar1,"archive_write_set_format_mtree(a)",paVar4);
  iVar2 = archive_write_open_memory(paVar4,buff,0xfff,&local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L')',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, sizeof(buff)-1, &used)",paVar4);
  paVar5 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                   ,L',',(uint)(paVar5 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar5,".");
  archive_entry_set_mode(paVar5,0x41ed);
  iVar2 = archive_write_header(paVar4,paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  paVar5 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                   ,L'3',(uint)(paVar5 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar5,"/file");
  archive_entry_set_size(paVar5,0);
  archive_entry_set_mode(paVar5,0x81a4);
  iVar2 = archive_write_header(paVar4,paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  paVar5 = archive_entry_new();
  local_38 = paVar5;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                   ,L';',(uint)(paVar5 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar5,"/dir");
  archive_entry_set_mode(paVar5,0x41ed);
  iVar2 = archive_write_header(paVar4,paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'>',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'A',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'B',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                   ,L'G',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'H',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar4);
  iVar2 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'I',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar4);
  iVar2 = archive_read_open_memory(paVar4,buff,local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used)",
                      paVar4);
  iVar2 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'M',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4);
  failure("The path should be just \".\"");
  pcVar6 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
             ,L'O',pcVar6,"archive_entry_pathname(ae)",".","\".\"",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'P',(ulong)mVar3,"archive_entry_mode(ae)",0x41ed,"AE_IFDIR | 0755",
                      (void *)0x0);
  iVar2 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'S',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4);
  failure("The path should have \"./\" prefix");
  pcVar6 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
             ,L'U',pcVar6,"archive_entry_pathname(ae)","./file","\"./file\"",(void *)0x0,L'\0');
  v1 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'V',v1,"archive_entry_size(ae)",0,"0",(void *)0x0);
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'W',(ulong)mVar3,"archive_entry_mode(ae)",0x81a4,"AE_IFREG | 0644",
                      (void *)0x0);
  iVar2 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'Z',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4);
  failure("The path should have \"./\" prefix");
  pcVar6 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
             ,L'\\',pcVar6,"archive_entry_pathname(ae)","./dir","\"./dir\"",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L']',(ulong)mVar3,"archive_entry_mode(ae)",0x41ed,"AE_IFDIR | 0755",
                      (void *)0x0);
  iVar2 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
  iVar2 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_absolute_path.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_mtree_absolute_path)
{
	struct archive_entry *ae;
	struct archive* a;
	size_t used;

	/* Create a mtree format archive. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

	/* Write "." file.  */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, ".");
	archive_entry_set_mode(ae, AE_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Write "/file" file.  */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "/file");
	archive_entry_set_size(ae, 0);
	archive_entry_set_mode(ae, AE_IFREG | 0644);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Write "/dir" directory.  */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "/dir");
	archive_entry_set_mode(ae, AE_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Read the data and check it.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	/* Read "." file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	failure("The path should be just \".\"");
	assertEqualString(archive_entry_pathname(ae), ".");
	assertEqualInt(archive_entry_mode(ae), AE_IFDIR | 0755);

	/* Read "/file" file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	failure("The path should have \"./\" prefix");
	assertEqualString(archive_entry_pathname(ae), "./file");
	assertEqualInt(archive_entry_size(ae), 0);
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);

	/* Read "/dir" file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	failure("The path should have \"./\" prefix");
	assertEqualString(archive_entry_pathname(ae), "./dir");
	assertEqualInt(archive_entry_mode(ae), AE_IFDIR | 0755);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}